

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QGesture_*,_QObject_*>_>::addStorage
          (Span<QHashPrivate::Node<QGesture_*,_QObject_*>_> *this)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Entry *__dest;
  long lVar10;
  long lVar11;
  uchar *puVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar40;
  undefined1 auVar38 [16];
  int iVar41;
  undefined1 auVar39 [16];
  int iVar42;
  int iVar53;
  int iVar54;
  int iVar55;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar66;
  undefined1 auVar65 [16];
  int iVar67;
  long lVar68;
  long lVar76;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  long lVar77;
  long lVar78;
  
  bVar1 = this->allocated;
  uVar15 = (ulong)bVar1;
  if (bVar1 == 0x30) {
    __dest = (Entry *)operator_new__(0x500);
    lVar14 = 0x50;
    uVar15 = 0x30;
  }
  else {
    if (bVar1 == 0) {
      __dest = (Entry *)operator_new__(0x300);
      lVar14 = 0x30;
      uVar15 = 0;
      goto LAB_002ddb8a;
    }
    lVar14 = uVar15 + 0x10;
    __dest = (Entry *)operator_new__((ulong)(uint)((int)lVar14 << 4));
  }
  memcpy(__dest,this->entries,(ulong)(uint)((int)uVar15 << 4));
LAB_002ddb8a:
  lVar10 = lVar14 - uVar15;
  lVar11 = lVar10 + -1;
  lVar68 = uVar15 + 0xe;
  lVar76 = uVar15 + 0xf;
  lVar26 = uVar15 + 0xc;
  lVar27 = uVar15 + 0xd;
  lVar28 = uVar15 + 10;
  lVar29 = uVar15 + 0xb;
  lVar30 = uVar15 + 8;
  lVar31 = uVar15 + 9;
  lVar32 = uVar15 + 6;
  lVar33 = uVar15 + 7;
  lVar34 = uVar15 + 4;
  lVar35 = uVar15 + 5;
  lVar77 = uVar15 + 2;
  lVar78 = uVar15 + 3;
  lVar16 = uVar15 + 1;
  auVar17._8_4_ = (int)lVar11;
  auVar17._0_8_ = lVar11;
  auVar17._12_4_ = (int)((ulong)lVar11 >> 0x20);
  puVar12 = __dest[0xf].storage.data + (uint)((int)uVar15 << 4);
  uVar13 = 0;
  do {
    auVar65._8_4_ = (int)uVar13;
    auVar65._0_8_ = uVar13;
    auVar65._12_4_ = (int)(uVar13 >> 0x20);
    auVar38 = auVar17 ^ _DAT_00660670;
    auVar36 = (auVar65 | _DAT_00660660) ^ _DAT_00660670;
    iVar66 = auVar38._0_4_;
    iVar42 = -(uint)(iVar66 < auVar36._0_4_);
    iVar67 = auVar38._4_4_;
    iVar53 = -(uint)(iVar67 < auVar36._4_4_);
    iVar40 = auVar38._8_4_;
    iVar54 = -(uint)(iVar40 < auVar36._8_4_);
    iVar41 = auVar38._12_4_;
    iVar55 = -(uint)(iVar41 < auVar36._12_4_);
    auVar69._4_4_ = iVar42;
    auVar69._0_4_ = iVar42;
    auVar69._8_4_ = iVar54;
    auVar69._12_4_ = iVar54;
    auVar61 = pshuflw(in_XMM12,auVar69,0xe8);
    auVar43._4_4_ = -(uint)(auVar36._4_4_ == iVar67);
    auVar43._12_4_ = -(uint)(auVar36._12_4_ == iVar41);
    auVar43._0_4_ = auVar43._4_4_;
    auVar43._8_4_ = auVar43._12_4_;
    auVar56 = pshuflw(in_XMM10,auVar43,0xe8);
    auVar37._4_4_ = iVar53;
    auVar37._0_4_ = iVar53;
    auVar37._8_4_ = iVar55;
    auVar37._12_4_ = iVar55;
    auVar38 = pshuflw(_DAT_00660670,auVar37,0xe8);
    auVar36._8_4_ = 0xffffffff;
    auVar36._0_8_ = 0xffffffffffffffff;
    auVar36._12_4_ = 0xffffffff;
    auVar36 = (auVar38 | auVar56 & auVar61) ^ auVar36;
    auVar36 = packssdw(auVar36,auVar36);
    if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      puVar12[-0xf0] = (char)uVar15 + '\x01';
    }
    auVar37 = auVar43 & auVar69 | auVar37;
    auVar36 = packssdw(auVar37,auVar37);
    auVar38._8_4_ = 0xffffffff;
    auVar38._0_8_ = 0xffffffffffffffff;
    auVar38._12_4_ = 0xffffffff;
    auVar36 = packssdw(auVar36 ^ auVar38,auVar36 ^ auVar38);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36._0_4_ >> 8 & 1) != 0) {
      puVar12[-0xe0] = (char)lVar16 + '\x01';
    }
    auVar36 = (auVar65 | _DAT_00660650) ^ _DAT_00660670;
    iVar42 = -(uint)(iVar66 < auVar36._0_4_);
    iVar54 = -(uint)(iVar67 < auVar36._4_4_);
    iVar53 = -(uint)(iVar40 < auVar36._8_4_);
    iVar55 = -(uint)(iVar41 < auVar36._12_4_);
    auVar61._4_4_ = iVar42;
    auVar61._0_4_ = iVar42;
    auVar61._8_4_ = iVar53;
    auVar61._12_4_ = iVar53;
    iVar42 = -(uint)(auVar36._4_4_ == iVar67);
    iVar53 = -(uint)(auVar36._12_4_ == iVar41);
    auVar70._4_4_ = iVar42;
    auVar70._0_4_ = iVar42;
    auVar70._8_4_ = iVar53;
    auVar70._12_4_ = iVar53;
    auVar62._4_4_ = iVar54;
    auVar62._0_4_ = iVar54;
    auVar62._8_4_ = iVar55;
    auVar62._12_4_ = iVar55;
    auVar36 = auVar70 & auVar61 | auVar62;
    auVar36 = packssdw(auVar36,auVar36);
    auVar56._8_4_ = 0xffffffff;
    auVar56._0_8_ = 0xffffffffffffffff;
    auVar56._12_4_ = 0xffffffff;
    auVar36 = packssdw(auVar36 ^ auVar56,auVar36 ^ auVar56);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36._0_4_ >> 0x10 & 1) != 0) {
      puVar12[-0xd0] = (char)lVar77 + '\x01';
    }
    auVar36 = pshufhw(auVar36,auVar61,0x84);
    auVar43 = pshufhw(auVar61,auVar70,0x84);
    auVar38 = pshufhw(auVar36,auVar62,0x84);
    auVar18._8_4_ = 0xffffffff;
    auVar18._0_8_ = 0xffffffffffffffff;
    auVar18._12_4_ = 0xffffffff;
    auVar18 = (auVar38 | auVar43 & auVar36) ^ auVar18;
    auVar36 = packssdw(auVar18,auVar18);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36._0_4_ >> 0x18 & 1) != 0) {
      puVar12[-0xc0] = (char)lVar78 + '\x01';
    }
    auVar36 = (auVar65 | _DAT_00660640) ^ _DAT_00660670;
    auVar57._0_4_ = -(uint)(iVar66 < auVar36._0_4_);
    auVar57._4_4_ = -(uint)(iVar67 < auVar36._4_4_);
    auVar57._8_4_ = -(uint)(iVar40 < auVar36._8_4_);
    auVar57._12_4_ = -(uint)(iVar41 < auVar36._12_4_);
    auVar71._4_4_ = auVar57._0_4_;
    auVar71._0_4_ = auVar57._0_4_;
    auVar71._8_4_ = auVar57._8_4_;
    auVar71._12_4_ = auVar57._8_4_;
    auVar43 = pshuflw(auVar62,auVar71,0xe8);
    auVar19._0_4_ = -(uint)(auVar36._0_4_ == iVar66);
    auVar19._4_4_ = -(uint)(auVar36._4_4_ == iVar67);
    auVar19._8_4_ = -(uint)(auVar36._8_4_ == iVar40);
    auVar19._12_4_ = -(uint)(auVar36._12_4_ == iVar41);
    auVar44._4_4_ = auVar19._4_4_;
    auVar44._0_4_ = auVar19._4_4_;
    auVar44._8_4_ = auVar19._12_4_;
    auVar44._12_4_ = auVar19._12_4_;
    auVar36 = pshuflw(auVar19,auVar44,0xe8);
    auVar45._4_4_ = auVar57._4_4_;
    auVar45._0_4_ = auVar57._4_4_;
    auVar45._8_4_ = auVar57._12_4_;
    auVar45._12_4_ = auVar57._12_4_;
    auVar38 = pshuflw(auVar57,auVar45,0xe8);
    auVar2._8_4_ = 0xffffffff;
    auVar2._0_8_ = 0xffffffffffffffff;
    auVar2._12_4_ = 0xffffffff;
    auVar36 = packssdw(auVar36 & auVar43,(auVar38 | auVar36 & auVar43) ^ auVar2);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      puVar12[-0xb0] = (char)lVar34 + '\x01';
    }
    auVar45 = auVar44 & auVar71 | auVar45;
    auVar38 = packssdw(auVar45,auVar45);
    auVar3._8_4_ = 0xffffffff;
    auVar3._0_8_ = 0xffffffffffffffff;
    auVar3._12_4_ = 0xffffffff;
    auVar36 = packssdw(auVar36,auVar38 ^ auVar3);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36._4_2_ >> 8 & 1) != 0) {
      puVar12[-0xa0] = (char)lVar35 + '\x01';
    }
    auVar36 = (auVar65 | _DAT_00660630) ^ _DAT_00660670;
    iVar42 = -(uint)(iVar66 < auVar36._0_4_);
    iVar54 = -(uint)(iVar67 < auVar36._4_4_);
    iVar53 = -(uint)(iVar40 < auVar36._8_4_);
    iVar55 = -(uint)(iVar41 < auVar36._12_4_);
    auVar46._4_4_ = iVar42;
    auVar46._0_4_ = iVar42;
    auVar46._8_4_ = iVar53;
    auVar46._12_4_ = iVar53;
    iVar42 = -(uint)(auVar36._4_4_ == iVar67);
    iVar53 = -(uint)(auVar36._12_4_ == iVar41);
    auVar63._4_4_ = iVar42;
    auVar63._0_4_ = iVar42;
    auVar63._8_4_ = iVar53;
    auVar63._12_4_ = iVar53;
    auVar72._4_4_ = iVar54;
    auVar72._0_4_ = iVar54;
    auVar72._8_4_ = iVar55;
    auVar72._12_4_ = iVar55;
    auVar36 = auVar63 & auVar46 | auVar72;
    auVar36 = packssdw(auVar36,auVar36);
    auVar4._8_4_ = 0xffffffff;
    auVar4._0_8_ = 0xffffffffffffffff;
    auVar4._12_4_ = 0xffffffff;
    auVar36 = packssdw(auVar36 ^ auVar4,auVar36 ^ auVar4);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      puVar12[-0x90] = (char)lVar32 + '\x01';
    }
    auVar36 = pshufhw(auVar36,auVar46,0x84);
    auVar43 = pshufhw(auVar46,auVar63,0x84);
    auVar38 = pshufhw(auVar36,auVar72,0x84);
    auVar20._8_4_ = 0xffffffff;
    auVar20._0_8_ = 0xffffffffffffffff;
    auVar20._12_4_ = 0xffffffff;
    auVar20 = (auVar38 | auVar43 & auVar36) ^ auVar20;
    auVar36 = packssdw(auVar20,auVar20);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36._6_2_ >> 8 & 1) != 0) {
      puVar12[-0x80] = (char)lVar33 + '\x01';
    }
    auVar36 = (auVar65 | _DAT_00660620) ^ _DAT_00660670;
    auVar58._0_4_ = -(uint)(iVar66 < auVar36._0_4_);
    auVar58._4_4_ = -(uint)(iVar67 < auVar36._4_4_);
    auVar58._8_4_ = -(uint)(iVar40 < auVar36._8_4_);
    auVar58._12_4_ = -(uint)(iVar41 < auVar36._12_4_);
    auVar73._4_4_ = auVar58._0_4_;
    auVar73._0_4_ = auVar58._0_4_;
    auVar73._8_4_ = auVar58._8_4_;
    auVar73._12_4_ = auVar58._8_4_;
    auVar43 = pshuflw(auVar63,auVar73,0xe8);
    auVar21._0_4_ = -(uint)(auVar36._0_4_ == iVar66);
    auVar21._4_4_ = -(uint)(auVar36._4_4_ == iVar67);
    auVar21._8_4_ = -(uint)(auVar36._8_4_ == iVar40);
    auVar21._12_4_ = -(uint)(auVar36._12_4_ == iVar41);
    auVar47._4_4_ = auVar21._4_4_;
    auVar47._0_4_ = auVar21._4_4_;
    auVar47._8_4_ = auVar21._12_4_;
    auVar47._12_4_ = auVar21._12_4_;
    auVar36 = pshuflw(auVar21,auVar47,0xe8);
    auVar48._4_4_ = auVar58._4_4_;
    auVar48._0_4_ = auVar58._4_4_;
    auVar48._8_4_ = auVar58._12_4_;
    auVar48._12_4_ = auVar58._12_4_;
    auVar38 = pshuflw(auVar58,auVar48,0xe8);
    auVar59._8_4_ = 0xffffffff;
    auVar59._0_8_ = 0xffffffffffffffff;
    auVar59._12_4_ = 0xffffffff;
    auVar59 = (auVar38 | auVar36 & auVar43) ^ auVar59;
    auVar38 = packssdw(auVar59,auVar59);
    auVar36 = packsswb(auVar36 & auVar43,auVar38);
    if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      puVar12[-0x70] = (char)lVar30 + '\x01';
    }
    auVar48 = auVar47 & auVar73 | auVar48;
    auVar38 = packssdw(auVar48,auVar48);
    auVar5._8_4_ = 0xffffffff;
    auVar5._0_8_ = 0xffffffffffffffff;
    auVar5._12_4_ = 0xffffffff;
    auVar38 = packssdw(auVar38 ^ auVar5,auVar38 ^ auVar5);
    auVar36 = packsswb(auVar36,auVar38);
    if ((auVar36._8_2_ >> 8 & 1) != 0) {
      puVar12[-0x60] = (char)lVar31 + '\x01';
    }
    auVar36 = (auVar65 | _DAT_00660610) ^ _DAT_00660670;
    iVar42 = -(uint)(iVar66 < auVar36._0_4_);
    iVar54 = -(uint)(iVar67 < auVar36._4_4_);
    iVar53 = -(uint)(iVar40 < auVar36._8_4_);
    iVar55 = -(uint)(iVar41 < auVar36._12_4_);
    auVar49._4_4_ = iVar42;
    auVar49._0_4_ = iVar42;
    auVar49._8_4_ = iVar53;
    auVar49._12_4_ = iVar53;
    iVar42 = -(uint)(auVar36._4_4_ == iVar67);
    iVar53 = -(uint)(auVar36._12_4_ == iVar41);
    auVar64._4_4_ = iVar42;
    auVar64._0_4_ = iVar42;
    auVar64._8_4_ = iVar53;
    auVar64._12_4_ = iVar53;
    auVar74._4_4_ = iVar54;
    auVar74._0_4_ = iVar54;
    auVar74._8_4_ = iVar55;
    auVar74._12_4_ = iVar55;
    auVar36 = auVar64 & auVar49 | auVar74;
    auVar36 = packssdw(auVar36,auVar36);
    auVar6._8_4_ = 0xffffffff;
    auVar6._0_8_ = 0xffffffffffffffff;
    auVar6._12_4_ = 0xffffffff;
    auVar36 = packssdw(auVar36 ^ auVar6,auVar36 ^ auVar6);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      puVar12[-0x50] = (char)lVar28 + '\x01';
    }
    auVar36 = pshufhw(auVar36,auVar49,0x84);
    auVar43 = pshufhw(auVar49,auVar64,0x84);
    auVar38 = pshufhw(auVar36,auVar74,0x84);
    auVar22._8_4_ = 0xffffffff;
    auVar22._0_8_ = 0xffffffffffffffff;
    auVar22._12_4_ = 0xffffffff;
    auVar22 = (auVar38 | auVar43 & auVar36) ^ auVar22;
    auVar36 = packssdw(auVar22,auVar22);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36._10_2_ >> 8 & 1) != 0) {
      puVar12[-0x40] = (char)lVar29 + '\x01';
    }
    auVar36 = (auVar65 | _DAT_00660600) ^ _DAT_00660670;
    auVar60._0_4_ = -(uint)(iVar66 < auVar36._0_4_);
    auVar60._4_4_ = -(uint)(iVar67 < auVar36._4_4_);
    auVar60._8_4_ = -(uint)(iVar40 < auVar36._8_4_);
    auVar60._12_4_ = -(uint)(iVar41 < auVar36._12_4_);
    auVar75._4_4_ = auVar60._0_4_;
    auVar75._0_4_ = auVar60._0_4_;
    auVar75._8_4_ = auVar60._8_4_;
    auVar75._12_4_ = auVar60._8_4_;
    auVar43 = pshuflw(auVar64,auVar75,0xe8);
    auVar23._0_4_ = -(uint)(auVar36._0_4_ == iVar66);
    auVar23._4_4_ = -(uint)(auVar36._4_4_ == iVar67);
    auVar23._8_4_ = -(uint)(auVar36._8_4_ == iVar40);
    auVar23._12_4_ = -(uint)(auVar36._12_4_ == iVar41);
    auVar50._4_4_ = auVar23._4_4_;
    auVar50._0_4_ = auVar23._4_4_;
    auVar50._8_4_ = auVar23._12_4_;
    auVar50._12_4_ = auVar23._12_4_;
    auVar36 = pshuflw(auVar23,auVar50,0xe8);
    auVar51._4_4_ = auVar60._4_4_;
    auVar51._0_4_ = auVar60._4_4_;
    auVar51._8_4_ = auVar60._12_4_;
    auVar51._12_4_ = auVar60._12_4_;
    auVar38 = pshuflw(auVar60,auVar51,0xe8);
    auVar7._8_4_ = 0xffffffff;
    auVar7._0_8_ = 0xffffffffffffffff;
    auVar7._12_4_ = 0xffffffff;
    auVar36 = packssdw(auVar36 & auVar43,(auVar38 | auVar36 & auVar43) ^ auVar7);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      puVar12[-0x30] = (char)lVar26 + '\x01';
    }
    auVar51 = auVar50 & auVar75 | auVar51;
    auVar38 = packssdw(auVar51,auVar51);
    auVar8._8_4_ = 0xffffffff;
    auVar8._0_8_ = 0xffffffffffffffff;
    auVar8._12_4_ = 0xffffffff;
    auVar36 = packssdw(auVar36,auVar38 ^ auVar8);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36._12_2_ >> 8 & 1) != 0) {
      puVar12[-0x20] = (char)lVar27 + '\x01';
    }
    auVar36 = (auVar65 | _DAT_006605f0) ^ _DAT_00660670;
    auVar24._0_4_ = -(uint)(iVar66 < auVar36._0_4_);
    auVar24._4_4_ = -(uint)(iVar67 < auVar36._4_4_);
    auVar24._8_4_ = -(uint)(iVar40 < auVar36._8_4_);
    auVar24._12_4_ = -(uint)(iVar41 < auVar36._12_4_);
    auVar52._4_4_ = auVar24._0_4_;
    auVar52._0_4_ = auVar24._0_4_;
    auVar52._8_4_ = auVar24._8_4_;
    auVar52._12_4_ = auVar24._8_4_;
    iVar66 = -(uint)(auVar36._4_4_ == iVar67);
    iVar67 = -(uint)(auVar36._12_4_ == iVar41);
    auVar39._4_4_ = iVar66;
    auVar39._0_4_ = iVar66;
    auVar39._8_4_ = iVar67;
    auVar39._12_4_ = iVar67;
    in_XMM12._4_4_ = auVar24._4_4_;
    in_XMM12._0_4_ = auVar24._4_4_;
    in_XMM12._8_4_ = auVar24._12_4_;
    in_XMM12._12_4_ = auVar24._12_4_;
    in_XMM10 = auVar39 & auVar52 | in_XMM12;
    auVar36 = packssdw(auVar24,in_XMM10);
    auVar9._8_4_ = 0xffffffff;
    auVar9._0_8_ = 0xffffffffffffffff;
    auVar9._12_4_ = 0xffffffff;
    auVar36 = packssdw(auVar36 ^ auVar9,auVar36 ^ auVar9);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      puVar12[-0x10] = (char)lVar68 + '\x01';
    }
    auVar36 = pshufhw(auVar36,auVar52,0x84);
    auVar43 = pshufhw(auVar39,auVar39,0x84);
    auVar38 = pshufhw(auVar36,in_XMM12,0x84);
    auVar25._8_4_ = 0xffffffff;
    auVar25._0_8_ = 0xffffffffffffffff;
    auVar25._12_4_ = 0xffffffff;
    auVar25 = (auVar38 | auVar43 & auVar36) ^ auVar25;
    auVar36 = packssdw(auVar25,auVar25);
    auVar36 = packsswb(auVar36,auVar36);
    if ((auVar36._14_2_ >> 8 & 1) != 0) {
      *puVar12 = (char)lVar76 + '\x01';
    }
    uVar13 = uVar13 + 0x10;
    uVar15 = uVar15 + 0x10;
    lVar16 = lVar16 + 0x10;
    lVar77 = lVar77 + 0x10;
    lVar78 = lVar78 + 0x10;
    lVar34 = lVar34 + 0x10;
    lVar35 = lVar35 + 0x10;
    lVar32 = lVar32 + 0x10;
    lVar33 = lVar33 + 0x10;
    lVar30 = lVar30 + 0x10;
    lVar31 = lVar31 + 0x10;
    lVar28 = lVar28 + 0x10;
    lVar29 = lVar29 + 0x10;
    lVar26 = lVar26 + 0x10;
    lVar27 = lVar27 + 0x10;
    lVar68 = lVar68 + 0x10;
    lVar76 = lVar76 + 0x10;
    puVar12 = puVar12 + 0x100;
  } while ((lVar10 + 0xfU & 0xfffffffffffffff0) != uVar13);
  if (this->entries != (Entry *)0x0) {
    operator_delete__(this->entries);
  }
  this->entries = __dest;
  this->allocated = (uchar)lVar14;
  return;
}

Assistant:

void addStorage()
    {
        Q_ASSERT(allocated < SpanConstants::NEntries);
        Q_ASSERT(nextFree == allocated);
        // the hash table should always be between 25 and 50% full
        // this implies that we on average have between 32 and 64 entries
        // in here. More exactly, we have a binominal distribution of the amount of
        // occupied entries.
        // For a 25% filled table, the average is 32 entries, with a 95% chance that we have between
        // 23 and 41 entries.
        // For a 50% filled table, the average is 64 entries, with a 95% chance that we have between
        // 53 and 75 entries.
        // Since we only resize the table once it's 50% filled and we want to avoid copies of
        // data where possible, we initially allocate 48 entries, then resize to 80 entries, after that
        // resize by increments of 16. That way, we usually only get one resize of the table
        // while filling it.
        size_t alloc;
        static_assert(SpanConstants::NEntries % 8 == 0);
        if (!allocated)
            alloc = SpanConstants::NEntries / 8 * 3;
        else if (allocated == SpanConstants::NEntries / 8 * 3)
            alloc = SpanConstants::NEntries / 8 * 5;
        else
            alloc = allocated + SpanConstants::NEntries/8;
        Entry *newEntries = new Entry[alloc];
        // we only add storage if the previous storage was fully filled, so
        // simply copy the old data over
        if constexpr (isRelocatable<Node>()) {
            if (allocated)
                memcpy(newEntries, entries, allocated * sizeof(Entry));
        } else {
            for (size_t i = 0; i < allocated; ++i) {
                new (&newEntries[i].node()) Node(std::move(entries[i].node()));
                entries[i].node().~Node();
            }
        }
        for (size_t i = allocated; i < alloc; ++i) {
            newEntries[i].nextFree() = uchar(i + 1);
        }
        delete[] entries;
        entries = newEntries;
        allocated = uchar(alloc);
    }